

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3FindFunctionMethod
              (sqlite3_vtab *pVtab,int nArg,char *zName,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **pxFunc,void **ppArg)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    iVar1 = strcmp(zName,*(char **)((long)&PTR_anon_var_dwarf_3d372_00236a10 + lVar2));
    if (iVar1 == 0) {
      *pxFunc = *(_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **)
                 ((long)&PTR_fts3SnippetFunc_00236a18 + lVar2);
      return 1;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  return 0;
}

Assistant:

static int fts3FindFunctionMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Number of SQL function arguments */
  const char *zName,              /* Name of SQL function */
  void (**pxFunc)(sqlite3_context*,int,sqlite3_value**), /* OUT: Result */
  void **ppArg                    /* Unused */
){
  struct Overloaded {
    const char *zName;
    void (*xFunc)(sqlite3_context*,int,sqlite3_value**);
  } aOverload[] = {
    { "snippet", fts3SnippetFunc },
    { "offsets", fts3OffsetsFunc },
    { "optimize", fts3OptimizeFunc },
    { "matchinfo", fts3MatchinfoFunc },
  };
  int i;                          /* Iterator variable */

  UNUSED_PARAMETER(pVtab);
  UNUSED_PARAMETER(nArg);
  UNUSED_PARAMETER(ppArg);

  for(i=0; i<SizeofArray(aOverload); i++){
    if( strcmp(zName, aOverload[i].zName)==0 ){
      *pxFunc = aOverload[i].xFunc;
      return 1;
    }
  }

  /* No function of the specified name was found. Return 0. */
  return 0;
}